

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O2

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDependencies
          (SDGDependenciesBuilder *this,DGBBlock *block,BasicBlock *B)

{
  pointer ppVVar1;
  _Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> local_38;
  
  LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
            ((ValVec *)&local_38,this->CDA,B);
  for (ppVVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppVVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; ppVVar1 = ppVVar1 + 1) {
    addControlDep(this,&block->super_DepDGElement,*ppVVar1);
  }
  std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void addControlDependencies(sdg::DGBBlock *block, llvm::BasicBlock &B) {
        assert(block);
        for (auto *dep : CDA->getDependencies(&B)) {
            addControlDep(block, dep);
        }
    }